

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O2

void xor_make_buffer_current
               (xor_setbuffer_t *buffer,xor_xorset_t *sets,uint32_t index,xor_keyindex_t *Q,
               size_t *Qsize)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint32_t uVar7;
  uint32_t *puVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  bVar2 = (byte)buffer->insignificantbits;
  uVar4 = index >> (bVar2 & 0x1f);
  puVar8 = buffer->counts;
  uVar6 = puVar8[uVar4];
  if (uVar6 != 0) {
    sVar9 = *Qsize;
    uVar10 = (ulong)(uVar4 << (bVar2 & 0x1f));
    uVar3 = uVar10 << 4 | 8;
    for (uVar5 = uVar10; uVar5 < uVar6 + uVar10; uVar5 = uVar5 + 1) {
      uVar1 = *(ulong *)((long)&buffer->buffer->hash + uVar3);
      uVar11 = uVar1 & 0xffffffff;
      uVar12 = sets[uVar11].xormask ^ *(ulong *)((long)buffer->buffer + (uVar3 - 8));
      sets[uVar11].xormask = uVar12;
      uVar7 = sets[uVar11].count - 1;
      sets[uVar11].count = uVar7;
      if (uVar7 == 1) {
        Q[sVar9].hash = uVar12;
        *(ulong *)&Q[sVar9].index = uVar1;
        sVar9 = sVar9 + 1;
        puVar8 = buffer->counts;
      }
      uVar6 = puVar8[uVar4];
      uVar3 = uVar3 + 0x10;
    }
    *Qsize = sVar9;
    puVar8[uVar4] = 0;
  }
  return;
}

Assistant:

static inline void xor_make_buffer_current(xor_setbuffer_t *buffer,
                                           xor_xorset_t *sets, uint32_t index,
                                           xor_keyindex_t *Q, size_t *Qsize) {
  uint32_t slot = index >> (uint32_t)buffer->insignificantbits;
  if(buffer->counts[slot] > 0) { // uncommon!
    size_t qsize = *Qsize;
    size_t offset = (slot << (uint32_t)buffer->insignificantbits);
    for (size_t i = offset; i < buffer->counts[slot] + offset; i++) {
      xor_keyindex_t ki = buffer->buffer[i];
      sets[ki.index].xormask ^= ki.hash;
      sets[ki.index].count--;
      if (sets[ki.index].count == 1) {// this branch might be hard to predict
        ki.hash = sets[ki.index].xormask;
        Q[qsize] = ki;
        qsize += 1;
      }
    }
    *Qsize = qsize;
    buffer->counts[slot] = 0;
  }
}